

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cut.cpp
# Opt level: O0

void find_cut(void)

{
  int iVar1;
  bool bVar2;
  int *piVar3;
  reference pvVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  ostream *poVar8;
  reference pvVar9;
  longlong lVar10;
  mapped_type *pmVar11;
  reference pvVar12;
  pair<unsigned_long,_int> pVar13;
  int local_e4;
  undefined1 local_e0 [4];
  int i_3;
  undefined1 local_d8 [16];
  int k;
  int flow;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_c0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_b8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_b0;
  iterator p;
  int j_1;
  int i_2;
  undefined1 local_98 [16];
  int to;
  int j;
  int local_80;
  size_type local_78;
  pair<unsigned_long,_int> local_70;
  pair<int,_int> local_60;
  int local_58 [2];
  int i_1;
  int local_48 [2];
  int i;
  int top;
  allocator<int> local_29;
  vector<int,_std::allocator<int>_> local_28;
  value_type_conflict local_10 [2];
  
  freopen("cut_min.txt","w",_stdout);
  local_10[1] = 0;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::dis,(long)(V * 2),
             local_10 + 1);
  local_10[0] = 0;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::ptr,(long)(V * 2),local_10)
  ;
  iVar1 = V * 2;
  std::allocator<int>::allocator(&local_29);
  std::vector<int,_std::allocator<int>_>::vector(&local_28,0,&local_29);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)(anonymous_namespace)::edges_dup,(long)iVar1,&local_28);
  std::vector<int,_std::allocator<int>_>::~vector(&local_28);
  std::allocator<int>::~allocator(&local_29);
  local_48[1] = 100;
  piVar3 = std::min<int>(local_48 + 1,&V);
  i = *piVar3;
  for (local_48[0] = 0; local_48[0] < V; local_48[0] = local_48[0] + 1) {
    local_58[1] = 0;
    _i_1 = std::make_pair<int,int&>(local_58 + 1,local_48);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               (anonymous_namespace)::top_flow,(value_type *)&i_1);
  }
  for (local_58[0] = 0; local_58[0] < V; local_58[0] = local_58[0] + 1) {
    pvVar4 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](&edge,(long)local_58[0]);
    local_78 = std::vector<int,_std::allocator<int>_>::size(pvVar4);
    pVar13 = std::make_pair<unsigned_long,int&>(&local_78,local_58);
    _to = (pointer)pVar13.first;
    local_80 = pVar13.second;
    local_70.first = (unsigned_long)_to;
    local_70.second = local_80;
    std::pair<int,_int>::pair<unsigned_long,_int,_true>(&local_60,&local_70);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               (anonymous_namespace)::top_degree,&local_60);
    local_98._12_4_ = 0;
    while( true ) {
      uVar5 = (ulong)(int)local_98._12_4_;
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&edge,(long)local_58[0]);
      sVar6 = std::vector<int,_std::allocator<int>_>::size(pvVar4);
      if (sVar6 <= uVar5) break;
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&edge,(long)local_58[0]);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)(int)local_98._12_4_)
      ;
      local_98._8_4_ = *pvVar7;
      dinic_addedge(local_58[0],local_98._8_4_ + V,V);
      local_98._12_4_ = local_98._12_4_ + 1;
    }
    dinic_addedge(local_58[0] + V,local_58[0],1);
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::rbegin
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_98);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::rend
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&j_1);
  std::
  stable_sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
              *)local_98,
             (reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
              *)&j_1);
  poVar8 = std::operator<<((ostream *)&std::cout,"Minimum cut between characters:");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  for (p._M_current._4_4_ = 0; iVar1 = p._M_current._4_4_, p._M_current._4_4_ < i;
      p._M_current._4_4_ = p._M_current._4_4_ + 1) {
    while (p._M_current._0_4_ = iVar1 + 1, (int)p._M_current < i) {
      pvVar9 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          (anonymous_namespace)::top_degree,(long)p._M_current._4_4_);
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&edge,(long)pvVar9->second);
      local_b8._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(pvVar4);
      pvVar9 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          (anonymous_namespace)::top_degree,(long)p._M_current._4_4_);
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&edge,(long)pvVar9->second);
      local_c0._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(pvVar4);
      pvVar9 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          (anonymous_namespace)::top_degree,(long)(int)p._M_current);
      local_b0 = std::
                 find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                           (local_b8,local_c0,&pvVar9->second);
      pvVar9 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          (anonymous_namespace)::top_degree,(long)p._M_current._4_4_);
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&edge,(long)pvVar9->second);
      _k = std::vector<int,_std::allocator<int>_>::end(pvVar4);
      bVar2 = __gnu_cxx::operator!=
                        (&local_b0,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&k);
      iVar1 = (int)p._M_current;
      if (!bVar2) {
        pvVar9 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                            (anonymous_namespace)::top_degree,(long)p._M_current._4_4_);
        iVar1 = pvVar9->second;
        pvVar9 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                            (anonymous_namespace)::top_degree,(long)(int)p._M_current);
        lVar10 = dinic_flow(iVar1,pvVar9->second + V);
        local_d8._12_4_ = (undefined4)lVar10;
        pvVar9 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                            (anonymous_namespace)::top_degree,(long)p._M_current._4_4_);
        pmVar11 = std::
                  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&name_abi_cxx11_,&pvVar9->second);
        poVar8 = std::operator<<((ostream *)&std::cout,(string *)pmVar11);
        poVar8 = std::operator<<(poVar8," -> ");
        pvVar9 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                            (anonymous_namespace)::top_degree,(long)(int)p._M_current);
        pmVar11 = std::
                  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&name_abi_cxx11_,&pvVar9->second);
        poVar8 = std::operator<<(poVar8,(string *)pmVar11);
        poVar8 = std::operator<<(poVar8," = ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_d8._12_4_);
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        for (local_d8._8_4_ = 0; uVar5 = (ulong)(int)local_d8._8_4_,
            sVar6 = std::
                    vector<(anonymous_namespace)::edge_s,_std::allocator<(anonymous_namespace)::edge_s>_>
                    ::size((vector<(anonymous_namespace)::edge_s,_std::allocator<(anonymous_namespace)::edge_s>_>
                            *)(anonymous_namespace)::edgelist), iVar1 = (int)p._M_current,
            uVar5 < sVar6; local_d8._8_4_ = local_d8._8_4_ + 1) {
          pvVar12 = std::
                    vector<(anonymous_namespace)::edge_s,_std::allocator<(anonymous_namespace)::edge_s>_>
                    ::operator[]((vector<(anonymous_namespace)::edge_s,_std::allocator<(anonymous_namespace)::edge_s>_>
                                  *)(anonymous_namespace)::edgelist,(long)(int)local_d8._8_4_);
          iVar1 = pvVar12->a;
          pvVar12 = std::
                    vector<(anonymous_namespace)::edge_s,_std::allocator<(anonymous_namespace)::edge_s>_>
                    ::operator[]((vector<(anonymous_namespace)::edge_s,_std::allocator<(anonymous_namespace)::edge_s>_>
                                  *)(anonymous_namespace)::edgelist,(long)(int)local_d8._8_4_);
          if ((iVar1 == pvVar12->b + V) &&
             (pvVar12 = std::
                        vector<(anonymous_namespace)::edge_s,_std::allocator<(anonymous_namespace)::edge_s>_>
                        ::operator[]((vector<(anonymous_namespace)::edge_s,_std::allocator<(anonymous_namespace)::edge_s>_>
                                      *)(anonymous_namespace)::edgelist,(long)(int)local_d8._8_4_),
             pvVar12->flow == 1)) {
            pvVar12 = std::
                      vector<(anonymous_namespace)::edge_s,_std::allocator<(anonymous_namespace)::edge_s>_>
                      ::operator[]((vector<(anonymous_namespace)::edge_s,_std::allocator<(anonymous_namespace)::edge_s>_>
                                    *)(anonymous_namespace)::edgelist,(long)(int)local_d8._8_4_);
            pvVar9 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                     operator[]((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 *)(anonymous_namespace)::top_flow,(long)pvVar12->b);
            pvVar9->first = pvVar9->first + 1;
          }
          pvVar12 = std::
                    vector<(anonymous_namespace)::edge_s,_std::allocator<(anonymous_namespace)::edge_s>_>
                    ::operator[]((vector<(anonymous_namespace)::edge_s,_std::allocator<(anonymous_namespace)::edge_s>_>
                                  *)(anonymous_namespace)::edgelist,(long)(int)local_d8._8_4_);
          pvVar12->flow = 0;
        }
      }
    }
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::rbegin
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_d8);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::rend
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_e0);
  std::
  stable_sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
              *)local_d8,
             (reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
              *)local_e0);
  poVar8 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<(poVar8,"Top involved characters in the flows:");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  for (local_e4 = 0; local_e4 < i; local_e4 = local_e4 + 1) {
    pvVar9 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        (anonymous_namespace)::top_flow,(long)local_e4);
    pmVar11 = std::
              map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&name_abi_cxx11_,&pvVar9->second);
    poVar8 = std::operator<<((ostream *)&std::cout,(string *)pmVar11);
    poVar8 = std::operator<<(poVar8," (");
    pvVar9 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        (anonymous_namespace)::top_flow,(long)local_e4);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,pvVar9->first);
    poVar8 = std::operator<<(poVar8,")");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void find_cut() {
    freopen("cut_min.txt", "w", stdout); // output file
    
    dis.resize(2 * V, 0);
    ptr.resize(2 * V, 0);
    edges_dup.resize(2 * V, vector<int>(0));
    const int top = min(100, V);

    for (int i = 0; i < V; i++)
        top_flow.push_back(make_pair(0, i));

    for (int i = 0; i < V; i++) {
        top_degree.push_back(make_pair(edge[i].size(), i));
        for (int j = 0; j < edge[i].size(); j++) {
            int to = edge[i][j];
            dinic_addedge(i, to + V, V);
        }
        dinic_addedge(i + V, i, 1);
    }
    
    stable_sort(top_degree.rbegin(), top_degree.rend());
    
    cout << "Minimum cut between characters:" << endl;
    for (int i = 0; i < top; i++) {
        for (int j = i + 1; j < top; j++) {
            vector<int>::iterator p = find(edge[top_degree[i].second].begin(), edge[top_degree[i].second].end(), top_degree[j].second);
            
            if (p != edge[top_degree[i].second].end())
                continue;
            
            int flow = dinic_flow(top_degree[i].second, top_degree[j].second + V);
            cout << name[top_degree[i].second] << " -> " << name[top_degree[j].second] << " = " << flow << endl;     

            for (int k = 0; k < edgelist.size(); k++) {
                if ((edgelist[k].a == (edgelist[k].b + V)) && (edgelist[k].flow == 1)) {
                    top_flow[edgelist[k].b].first++;
                }
                edgelist[k].flow = 0;
            }
        }
    }
    
    stable_sort(top_flow.rbegin(), top_flow.rend());

    cout << endl << "Top involved characters in the flows:" << endl;
    for (int i = 0; i < top; i++) {
        cout << name[top_flow[i].second] << " (" << top_flow[i].first << ")" << endl;
    }
}